

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_add16(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dest,TCGv_i32 t0,TCGv_i32 t1)

{
  TCGv_i32 a2;
  TCGTemp *ts;
  uintptr_t o_1;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  a2 = t0 + (long)&tcg_ctx->pool_cur;
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i32,(TCGArg)ts,(TCGArg)a2,
                      (TCGArg)(t1 + (long)&tcg_ctx->pool_cur));
  tcg_gen_andi_i32_aarch64
            (tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),(TCGv_i32)((long)ts - (long)tcg_ctx),
             0x8000);
  tcg_gen_andi_i32_aarch64(tcg_ctx,t0,t0,-0x8001);
  tcg_gen_andi_i32_aarch64(tcg_ctx,t1,t1,-0x8001);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i32,(TCGArg)a2,(TCGArg)a2,
                      (TCGArg)(t1 + (long)&tcg_ctx->pool_cur));
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_xor_i32,(TCGArg)(dest + (long)tcg_ctx),(TCGArg)a2,(TCGArg)ts)
  ;
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_add16(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_xor_i32(tcg_ctx, tmp, t0, t1);
    tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 0x8000);
    tcg_gen_andi_i32(tcg_ctx, t0, t0, ~0x8000);
    tcg_gen_andi_i32(tcg_ctx, t1, t1, ~0x8000);
    tcg_gen_add_i32(tcg_ctx, t0, t0, t1);
    tcg_gen_xor_i32(tcg_ctx, dest, t0, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
}